

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

void rlMultMatrixf(float *matf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Matrix *pMVar33;
  
  pMVar33 = RLGL.State.currentMatrix;
  fVar17 = (RLGL.State.currentMatrix)->m0;
  fVar18 = (RLGL.State.currentMatrix)->m4;
  fVar19 = (RLGL.State.currentMatrix)->m8;
  fVar20 = (RLGL.State.currentMatrix)->m12;
  fVar21 = (RLGL.State.currentMatrix)->m1;
  fVar22 = (RLGL.State.currentMatrix)->m5;
  fVar23 = (RLGL.State.currentMatrix)->m9;
  fVar24 = (RLGL.State.currentMatrix)->m13;
  fVar25 = (RLGL.State.currentMatrix)->m2;
  fVar26 = (RLGL.State.currentMatrix)->m6;
  fVar27 = (RLGL.State.currentMatrix)->m10;
  fVar28 = (RLGL.State.currentMatrix)->m14;
  fVar29 = (RLGL.State.currentMatrix)->m3;
  fVar30 = (RLGL.State.currentMatrix)->m7;
  fVar31 = (RLGL.State.currentMatrix)->m11;
  fVar32 = (RLGL.State.currentMatrix)->m15;
  fVar1 = matf[4];
  fVar2 = *matf;
  fVar3 = matf[1];
  fVar4 = matf[2];
  fVar5 = matf[3];
  fVar6 = matf[8];
  fVar7 = matf[0xc];
  fVar8 = matf[5];
  fVar9 = matf[9];
  fVar10 = matf[0xd];
  fVar11 = matf[6];
  fVar12 = matf[10];
  fVar13 = matf[0xe];
  fVar14 = matf[7];
  fVar15 = matf[0xb];
  fVar16 = matf[0xf];
  (RLGL.State.currentMatrix)->m0 = fVar7 * fVar29 + fVar6 * fVar25 + fVar2 * fVar17 + fVar1 * fVar21
  ;
  pMVar33->m4 = fVar7 * fVar30 + fVar6 * fVar26 + fVar2 * fVar18 + fVar1 * fVar22;
  pMVar33->m8 = fVar7 * fVar31 + fVar6 * fVar27 + fVar2 * fVar19 + fVar1 * fVar23;
  pMVar33->m12 = fVar7 * fVar32 + fVar6 * fVar28 + fVar2 * fVar20 + fVar1 * fVar24;
  pMVar33->m1 = fVar10 * fVar29 + fVar9 * fVar25 + fVar3 * fVar17 + fVar8 * fVar21;
  pMVar33->m5 = fVar10 * fVar30 + fVar9 * fVar26 + fVar3 * fVar18 + fVar8 * fVar22;
  pMVar33->m9 = fVar10 * fVar31 + fVar9 * fVar27 + fVar3 * fVar19 + fVar8 * fVar23;
  pMVar33->m13 = fVar10 * fVar32 + fVar9 * fVar28 + fVar3 * fVar20 + fVar8 * fVar24;
  pMVar33->m2 = fVar13 * fVar29 + fVar12 * fVar25 + fVar4 * fVar17 + fVar11 * fVar21;
  pMVar33->m6 = fVar13 * fVar30 + fVar12 * fVar26 + fVar4 * fVar18 + fVar11 * fVar22;
  pMVar33->m10 = fVar13 * fVar31 + fVar12 * fVar27 + fVar4 * fVar19 + fVar11 * fVar23;
  pMVar33->m14 = fVar13 * fVar32 + fVar12 * fVar28 + fVar4 * fVar20 + fVar11 * fVar24;
  pMVar33->m3 = fVar16 * fVar29 + fVar15 * fVar25 + fVar5 * fVar17 + fVar14 * fVar21;
  pMVar33->m7 = fVar16 * fVar30 + fVar15 * fVar26 + fVar5 * fVar18 + fVar14 * fVar22;
  pMVar33->m11 = fVar16 * fVar31 + fVar15 * fVar27 + fVar5 * fVar19 + fVar14 * fVar23;
  pMVar33->m15 = fVar16 * fVar32 + fVar15 * fVar28 + fVar5 * fVar20 + fVar14 * fVar24;
  return;
}

Assistant:

void rlMultMatrixf(float *matf)
{
    // Matrix creation from array
    Matrix mat = { matf[0], matf[4], matf[8], matf[12],
                   matf[1], matf[5], matf[9], matf[13],
                   matf[2], matf[6], matf[10], matf[14],
                   matf[3], matf[7], matf[11], matf[15] };

    *RLGL.State.currentMatrix = MatrixMultiply(*RLGL.State.currentMatrix, mat);
}